

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O0

int __thiscall
AddForm::verify(AddForm *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  PcodeOp *this_00;
  bool bVar1;
  int4 iVar2;
  OpCode OVar3;
  Varnode *pVVar4;
  PcodeOp *pPVar5;
  reference ppPVar6;
  uintb uVar7;
  uintb uVar8;
  AddForm *pAVar9;
  Varnode *tmpvn_1;
  _List_const_iterator<PcodeOp_*> local_58;
  const_iterator enditer2;
  const_iterator iter2;
  int4 j;
  Varnode *tmpvn;
  int4 i;
  PcodeOp *op_local;
  Varnode *l_local;
  Varnode *h_local;
  AddForm *this_local;
  
  this->hi1 = (Varnode *)ctx;
  this->lo1 = (Varnode *)sig;
  iVar2 = PcodeOp::getSlot((PcodeOp *)siglen,this->hi1);
  this->slot1 = iVar2;
  tmpvn._4_4_ = 0;
  pAVar9 = this;
  do {
    if (2 < (int)tmpvn._4_4_) {
      this_local._7_1_ = 0;
LAB_0064fc77:
      return (int)CONCAT71((int7)((ulong)pAVar9 >> 8),this_local._7_1_);
    }
    if (tmpvn._4_4_ == 0) {
      pVVar4 = PcodeOp::getOut((PcodeOp *)siglen);
      pPVar5 = Varnode::loneDescend(pVVar4);
      this->add2 = pPVar5;
      if ((this->add2 == (PcodeOp *)0x0) ||
         (OVar3 = PcodeOp::code(this->add2), OVar3 != CPUI_INT_ADD)) goto LAB_0064fc65;
      pVVar4 = PcodeOp::getOut(this->add2);
      this->reshi = pVVar4;
      pVVar4 = PcodeOp::getIn((PcodeOp *)siglen,1 - this->slot1);
      this->hizext1 = pVVar4;
      pPVar5 = this->add2;
      this_00 = this->add2;
      pVVar4 = PcodeOp::getOut((PcodeOp *)siglen);
      iVar2 = PcodeOp::getSlot(this_00,pVVar4);
      pVVar4 = PcodeOp::getIn(pPVar5,1 - iVar2);
      this->hizext2 = pVVar4;
LAB_0064f995:
      for (iter2._M_node._4_4_ = 0; iter2._M_node._4_4_ < 2;
          iter2._M_node._4_4_ = iter2._M_node._4_4_ + 1) {
        if (tmpvn._4_4_ == 2) {
          bVar1 = Varnode::isWritten(this->hizext1);
          if (bVar1) {
            pPVar5 = Varnode::getDef(this->hizext1);
            this->zextop = pPVar5;
            this->hi2 = (Varnode *)0x0;
            goto LAB_0064fa75;
          }
        }
        else if (iter2._M_node._4_4_ == 0) {
          bVar1 = Varnode::isWritten(this->hizext1);
          if (bVar1) {
            pPVar5 = Varnode::getDef(this->hizext1);
            this->zextop = pPVar5;
            this->hi2 = this->hizext2;
LAB_0064fa75:
            bVar1 = checkForCarry(this,this->zextop);
            if (bVar1) {
              std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&enditer2);
              std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_58);
              enditer2 = Varnode::beginDescend(this->lo1);
              local_58._M_node = (_List_node_base *)Varnode::endDescend(this->lo1);
LAB_0064fad2:
              do {
                bVar1 = std::operator!=(&enditer2,&local_58);
                if (!bVar1) break;
                ppPVar6 = std::_List_const_iterator<PcodeOp_*>::operator*(&enditer2);
                this->loadd = *ppPVar6;
                std::_List_const_iterator<PcodeOp_*>::operator++(&enditer2);
                OVar3 = PcodeOp::code(this->loadd);
                if (OVar3 == CPUI_INT_ADD) {
                  pPVar5 = this->loadd;
                  iVar2 = PcodeOp::getSlot(this->loadd,this->lo1);
                  pVVar4 = PcodeOp::getIn(pPVar5,1 - iVar2);
                  if (this->lo2 == (Varnode *)0x0) {
                    bVar1 = Varnode::isConstant(pVVar4);
                    if ((!bVar1) || (uVar7 = Varnode::getOffset(pVVar4), uVar7 != this->negconst))
                    goto LAB_0064fad2;
                    this->lo2 = pVVar4;
                  }
                  else {
                    bVar1 = Varnode::isConstant(this->lo2);
                    if (bVar1) {
                      bVar1 = Varnode::isConstant(pVVar4);
                      if (!bVar1) goto LAB_0064fad2;
                      uVar7 = Varnode::getOffset(this->lo2);
                      uVar8 = Varnode::getOffset(pVVar4);
                      if (uVar7 != uVar8) goto LAB_0064fad2;
                    }
                    else {
                      pPVar5 = this->loadd;
                      iVar2 = PcodeOp::getSlot(this->loadd,this->lo1);
                      pVVar4 = PcodeOp::getIn(pPVar5,1 - iVar2);
                      if (pVVar4 != this->lo2) goto LAB_0064fad2;
                    }
                  }
                  pVVar4 = PcodeOp::getOut(this->loadd);
                  this->reslo = pVVar4;
                  this_local._7_1_ = 1;
                  pAVar9 = this;
                  goto LAB_0064fc77;
                }
              } while( true );
            }
          }
        }
        else {
          bVar1 = Varnode::isWritten(this->hizext2);
          if (bVar1) {
            pPVar5 = Varnode::getDef(this->hizext2);
            this->zextop = pPVar5;
            this->hi2 = this->hizext1;
            goto LAB_0064fa75;
          }
        }
      }
    }
    else {
      if (tmpvn._4_4_ != 1) {
        pVVar4 = PcodeOp::getOut((PcodeOp *)siglen);
        this->reshi = pVVar4;
        pVVar4 = PcodeOp::getIn((PcodeOp *)siglen,1 - this->slot1);
        this->hizext1 = pVVar4;
        this->hizext2 = (Varnode *)0x0;
        goto LAB_0064f995;
      }
      pVVar4 = PcodeOp::getIn((PcodeOp *)siglen,1 - this->slot1);
      bVar1 = Varnode::isWritten(pVVar4);
      if (bVar1) {
        pPVar5 = Varnode::getDef(pVVar4);
        this->add2 = pPVar5;
        OVar3 = PcodeOp::code(this->add2);
        if (OVar3 == CPUI_INT_ADD) {
          pVVar4 = PcodeOp::getOut((PcodeOp *)siglen);
          this->reshi = pVVar4;
          pVVar4 = PcodeOp::getIn(this->add2,0);
          this->hizext1 = pVVar4;
          pVVar4 = PcodeOp::getIn(this->add2,1);
          this->hizext2 = pVVar4;
          goto LAB_0064f995;
        }
      }
    }
LAB_0064fc65:
    tmpvn._4_4_ = tmpvn._4_4_ + 1;
    pAVar9 = (AddForm *)(ulong)tmpvn._4_4_;
  } while( true );
}

Assistant:

bool AddForm::verify(Varnode *h,Varnode *l,PcodeOp *op)

{
  hi1 = h;
  lo1 = l;
  slot1 = op->getSlot(hi1);
  for(int4 i=0;i<3;++i) {
    if (i==0) {		// Assume we have to descend one more add
      add2 = op->getOut()->loneDescend();
      if (add2 == (PcodeOp *)0) continue;
      if (add2->code() != CPUI_INT_ADD) continue;
      reshi = add2->getOut();
      hizext1 = op->getIn(1-slot1);
      hizext2 = add2->getIn(1-add2->getSlot(op->getOut()));
    }
    else if (i==1) {		// Assume we are at the bottom most of two adds
      Varnode *tmpvn = op->getIn(1-slot1);
      if (!tmpvn->isWritten()) continue;
      add2 = tmpvn->getDef();
      if (add2->code() != CPUI_INT_ADD) continue;
      reshi = op->getOut();
      hizext1 = add2->getIn(0);
      hizext2 = add2->getIn(1);
    }
    else {			// Assume there is only one add, with second implied add by 0
      reshi = op->getOut();
      hizext1 = op->getIn(1-slot1);
      hizext2 = (Varnode *)0;
    }
    for(int4 j=0;j<2;++j) {
      if (i==2) {		// hi2 is an implied 0
	if (!hizext1->isWritten()) continue;
	zextop = hizext1->getDef();
	hi2 = (Varnode *)0;
      }
      else if (j==0) {
	if (!hizext1->isWritten()) continue;
	zextop = hizext1->getDef();
	hi2 = hizext2;
      }
      else {
	if (!hizext2->isWritten()) continue;
	zextop = hizext2->getDef();
	hi2 = hizext1;
      }
      if (!checkForCarry(zextop)) continue; // Calculate lo2 and negconst

      list<PcodeOp *>::const_iterator iter2,enditer2;
      iter2 = lo1->beginDescend();
      enditer2 = lo1->endDescend();
      while(iter2 != enditer2) {
	loadd = *iter2;
	++iter2;
	if (loadd->code() != CPUI_INT_ADD) continue;
	Varnode *tmpvn = loadd->getIn(1-loadd->getSlot(lo1));
	if (lo2 == (Varnode *)0) {
	  if (!tmpvn->isConstant()) continue;
	  if (tmpvn->getOffset() != negconst) continue;	// Must add same constant used to calculate CARRY
	  lo2 = tmpvn;
	}
	else if (lo2->isConstant()) {
	  if (!tmpvn->isConstant()) continue;
	  if (lo2->getOffset() != tmpvn->getOffset()) continue;
	}
	else if (loadd->getIn(1-loadd->getSlot(lo1)) != lo2) // Must add same value used to calculate CARRY
	  continue;
	reslo = loadd->getOut();
	return true;
      }
    }
  }
  return false;
}